

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_draw_command * nk__draw_list_next(nk_draw_command *cmd,nk_buffer *buffer,nk_draw_list *canvas)

{
  nk_draw_command *pnVar1;
  nk_draw_list *in_RDX;
  nk_buffer *in_RSI;
  nk_draw_command *in_RDI;
  nk_draw_command *end;
  nk_draw_command *local_8;
  
  if (((in_RDI == (nk_draw_command *)0x0) || (in_RSI == (nk_buffer *)0x0)) ||
     (in_RDX == (nk_draw_list *)0x0)) {
    local_8 = (nk_draw_command *)0x0;
  }
  else {
    pnVar1 = nk__draw_list_end(in_RDX,in_RSI);
    if (pnVar1 < in_RDI) {
      local_8 = in_RDI + -1;
    }
    else {
      local_8 = (nk_draw_command *)0x0;
    }
  }
  return local_8;
}

Assistant:

NK_API const struct nk_draw_command*
nk__draw_list_next(const struct nk_draw_command *cmd,
const struct nk_buffer *buffer, const struct nk_draw_list *canvas)
{
const struct nk_draw_command *end;
NK_ASSERT(buffer);
NK_ASSERT(canvas);
if (!cmd || !buffer || !canvas)
return 0;

end = nk__draw_list_end(canvas, buffer);
if (cmd <= end) return 0;
return (cmd-1);
}